

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_adjust_closed_stream(nghttp2_session *session)

{
  uint uVar1;
  nghttp2_stream *stream;
  nghttp2_stream *pnVar2;
  int iVar3;
  nghttp2_stream **ppnVar4;
  size_t sVar5;
  
  uVar1 = (session->local_settings).max_concurrent_streams;
  if (uVar1 == 0xffffffff) {
    uVar1 = session->pending_local_max_concurrent_stream;
  }
  sVar5 = session->num_closed_streams;
  while( true ) {
    if ((sVar5 == 0) || (sVar5 + session->num_incoming_streams <= (ulong)uVar1)) {
      return 0;
    }
    stream = session->closed_stream_head;
    if (stream == (nghttp2_stream *)0x0) {
      __assert_fail("head_stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x67d,"int nghttp2_session_adjust_closed_stream(nghttp2_session *)");
    }
    pnVar2 = stream->closed_next;
    iVar3 = nghttp2_session_destroy_stream(session,stream);
    if (iVar3 != 0) break;
    ppnVar4 = &pnVar2->closed_prev;
    if (pnVar2 == (nghttp2_stream *)0x0) {
      ppnVar4 = &session->closed_stream_tail;
    }
    session->closed_stream_head = pnVar2;
    *ppnVar4 = (nghttp2_stream *)0x0;
    sVar5 = session->num_closed_streams - 1;
    session->num_closed_streams = sVar5;
  }
  return iVar3;
}

Assistant:

int nghttp2_session_adjust_closed_stream(nghttp2_session *session) {
  size_t num_stream_max;
  int rv;

  if (session->local_settings.max_concurrent_streams ==
      NGHTTP2_DEFAULT_MAX_CONCURRENT_STREAMS) {
    num_stream_max = session->pending_local_max_concurrent_stream;
  } else {
    num_stream_max = session->local_settings.max_concurrent_streams;
  }

  DEBUGF("stream: adjusting kept closed streams num_closed_streams=%zu, "
         "num_incoming_streams=%zu, max_concurrent_streams=%zu\n",
         session->num_closed_streams, session->num_incoming_streams,
         num_stream_max);

  while (session->num_closed_streams > 0 &&
         session->num_closed_streams + session->num_incoming_streams >
             num_stream_max) {
    nghttp2_stream *head_stream;
    nghttp2_stream *next;

    head_stream = session->closed_stream_head;

    assert(head_stream);

    next = head_stream->closed_next;

    rv = nghttp2_session_destroy_stream(session, head_stream);
    if (rv != 0) {
      return rv;
    }

    /* head_stream is now freed */

    session->closed_stream_head = next;

    if (session->closed_stream_head) {
      session->closed_stream_head->closed_prev = NULL;
    } else {
      session->closed_stream_tail = NULL;
    }

    --session->num_closed_streams;
  }

  return 0;
}